

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,Descriptor *value_descriptor,string *serialized_value)

{
  bool bVar1;
  Message *this_00;
  MessageLite *this_01;
  string_view message;
  string sub_delimiter;
  DynamicMessageFactory factory;
  undefined1 local_158 [32];
  string local_138;
  string local_118;
  DynamicMessageFactory local_f8;
  string_view local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  DynamicMessageFactory::DynamicMessageFactory(&local_f8);
  this_00 = DynamicMessageFactory::GetPrototype(&local_f8,value_descriptor);
  if (this_00 == (Message *)0x0) {
    bVar1 = false;
    goto LAB_002c9ad5;
  }
  this_01 = &Message::New(this_00)->super_MessageLite;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeMessageDelimiter(this,&local_138);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_118,(string *)&local_138);
    bVar1 = ConsumeMessage(this,(Message *)this_01,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (!bVar1) goto LAB_002c9abb;
    if (this->allow_partial_ == true) {
      bVar1 = true;
      MessageLite::AppendPartialToString(this_01,serialized_value);
    }
    else {
      bVar1 = MessageLite::IsInitialized(this_01);
      if (!bVar1) {
        local_58.piece_ = absl::lts_20240722::NullSafeStringView("Value of type \"");
        local_88.piece_._M_str = value_descriptor->all_names_[1]._M_dataplus._M_p;
        local_88.piece_._M_len = value_descriptor->all_names_[1]._M_string_length;
        local_b8 = absl::lts_20240722::NullSafeStringView
                             ("\" stored in google.protobuf.Any has missing required fields");
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_158,&local_58,&local_88);
        message._M_str = (char *)local_158._0_8_;
        message._M_len = local_158._8_8_;
        ReportError(this,message);
        std::__cxx11::string::~string((string *)local_158);
        goto LAB_002c9abb;
      }
      bVar1 = true;
      MessageLite::AppendToString(this_01,serialized_value);
    }
  }
  else {
LAB_002c9abb:
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_138);
  if (this_01 != (MessageLite *)0x0) {
    (*this_01->_vptr_MessageLite[1])(this_01);
  }
LAB_002c9ad5:
  DynamicMessageFactory::~DynamicMessageFactory(&local_f8);
  return bVar1;
}

Assistant:

bool ConsumeAnyValue(const Descriptor* value_descriptor,
                       std::string* serialized_value) {
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == nullptr) {
      return false;
    }
    std::unique_ptr<Message> value(value_prototype->New());
    std::string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(absl::StrCat(
            "Value of type \"", value_descriptor->full_name(),
            "\" stored in google.protobuf.Any has missing required fields"));
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }